

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.h
# Opt level: O0

void __thiscall
slang::ast::EventListControl::visitExprs<slang::ast::builtins::SequenceMethodExprVisitor&>
          (EventListControl *this,SequenceMethodExprVisitor *visitor)

{
  iterator ppTVar1;
  TimingControl *ev;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::TimingControl_*const,_18446744073709551615UL> *__range3;
  SequenceMethodExprVisitor *visitor_local;
  EventListControl *this_local;
  
  __end3 = nonstd::span_lite::span<const_slang::ast::TimingControl_*const,_18446744073709551615UL>::
           begin(&this->events);
  ppTVar1 = nonstd::span_lite::span<const_slang::ast::TimingControl_*const,_18446744073709551615UL>
            ::end(&this->events);
  for (; __end3 != ppTVar1; __end3 = __end3 + 1) {
    TimingControl::visit<slang::ast::builtins::SequenceMethodExprVisitor>(*__end3,visitor);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto ev : events)
            ev->visit(visitor);
    }